

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void arm_tr_translate_insn(DisasContextBase *dcbase,CPUState *cpu)

{
  CPUArchState_conflict1 *env;
  target_ulong tVar1;
  TCGContext_conflict1 *tcg_ctx_00;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  _Bool _Var6;
  DisasJumpType DVar7;
  int iVar8;
  undefined1 *puVar9;
  long *plVar10;
  DisasJumpType insn;
  arg_SB *a;
  uint32_t target_el;
  uint uVar11;
  TCGContext_conflict1 *tcg_ctx;
  arg_CPS local_38;
  
  env = (CPUArchState_conflict1 *)cpu->env_ptr;
  _Var6 = arm_pre_translate_insn((DisasContext_conflict1 *)dcbase);
  if (_Var6) {
    return;
  }
  local_38._0_8_ = dcbase->pc_next;
  tVar1 = dcbase[8].pc_next;
  if (*(int *)(tVar1 + 0x57c) == 0) {
    if (*(target_ulong *)(tVar1 + 0x578 + (long)*(int *)(tVar1 + 0x39e0) * 8) == local_38._0_8_)
    goto LAB_0063ebe5;
  }
  else {
    puVar9 = (undefined1 *)g_tree_lookup(*(GTree **)(tVar1 + 0x780),&local_38);
    if (puVar9 == &DAT_00000001) goto LAB_0063ebe5;
  }
  a = (arg_SB *)dcbase->pc_next;
  dcbase[1].pc_first = (target_ulong)a;
  iVar8 = *(int *)((long)&dcbase[2].pc_first + 4);
  DVar7 = cpu_ldl_code_aarch64(env,(abi_ptr)a);
  insn = DVar7 >> 0x18 | (DVar7 & 0xff0000) >> 8 | (DVar7 & 0xff00) << 8 | DVar7 << 0x18;
  if (iVar8 == 0) {
    insn = DVar7;
  }
  dcbase[1].is_jmp = insn;
  tVar1 = dcbase[8].pc_next;
  if (*(int *)(tVar1 + 0x578) != 0) {
LAB_0063ebe5:
    dcbase->is_jmp = DISAS_TARGET_2;
    return;
  }
  dcbase->pc_next = dcbase->pc_next + 4;
  if ((dcbase[4].pc_first & 0x200) != 0) {
    if ((dcbase[2].is_jmp != 0x17) || (target_el = 3, *(char *)((long)&dcbase[3].tb + 4) == '\0')) {
      target_el = 1;
      if (1 < dcbase[3].max_insns) {
        target_el = dcbase[3].max_insns;
      }
    }
    gen_exception_insn((DisasContext_conflict1 *)dcbase,(uint32_t)dcbase[1].pc_first,0x12,0x2000000,
                       target_el);
    goto LAB_0063edf7;
  }
  uVar11 = insn >> 0x1c;
  plVar10 = *(long **)(tVar1 + 0x358);
  if (plVar10 != (long *)0x0) {
    tcg_ctx_00 = *(TCGContext_conflict1 **)(tVar1 + 0x2e8);
    uVar2 = dcbase[1].pc_first;
    do {
      lVar3 = plVar10[1];
      uVar4 = *(ulong *)(lVar3 + 0x18);
      uVar5 = *(ulong *)(lVar3 + 0x20);
      a = (arg_SB *)CONCAT71((int7)(uVar4 >> 8),uVar5 < uVar4 || uVar2 <= uVar5 && uVar4 <= uVar2);
      if ((uVar5 < uVar4 || uVar2 <= uVar5 && uVar4 <= uVar2) && (*(char *)(lVar3 + 0x14) != '\x01')
         ) {
        tcg_gen_op2_aarch64(tcg_ctx_00,INDEX_op_movi_i32,
                            (TCGArg)(tcg_ctx_00->cpu_R[0xf] + (long)tcg_ctx_00),(long)(int)uVar2);
        a = (arg_SB *)0x4;
        gen_uc_tracecode(tcg_ctx_00,4,2,(void *)dcbase[8].pc_next,dcbase[1].pc_first);
        check_exit_request_aarch64(tcg_ctx_00);
        break;
      }
      plVar10 = (long *)*plVar10;
    } while (plVar10 != (long *)0x0);
  }
  if (uVar11 == 0xe) {
LAB_0063eda7:
    _Var6 = disas_a32((DisasContext_conflict1 *)dcbase,insn);
    if ((_Var6) || (_Var6 = disas_vfp((DisasContext_conflict1 *)dcbase,insn), _Var6))
    goto LAB_0063edf7;
    if (((insn & 0xe00) != 0xa00) && (0xfffffffc < (insn >> 0x18 & 0xf) - 0xf)) {
      iVar8 = disas_coproc_insn((DisasContext_conflict1 *)dcbase,insn);
      goto LAB_0063edeb;
    }
  }
  else {
    if (uVar11 != 0xf) {
      arm_skip_unless((DisasContext_conflict1 *)dcbase,uVar11);
      goto LAB_0063eda7;
    }
    uVar2 = dcbase[4].pc_first;
    if ((short)uVar2 < 0) {
      switch(insn >> 0x19) {
      case 0x78:
        if ((insn & 0x1f1fc20) == 0x1010000) {
          if ((insn & 0xe01df) == DISAS_NEXT) {
            _Var6 = trans_SETEND((DisasContext_conflict1 *)dcbase,
                                 (arg_SETEND *)(ulong)(insn >> 9 & 1));
            goto LAB_0063eeef;
          }
        }
        else if ((insn & 0x1f1fc20) == 0x1000000) {
          local_38.imod = insn >> 0x12 & 3;
          local_38.M = insn >> 0x11 & 1;
          local_38.I = insn >> 7 & 1;
          local_38._0_8_ = CONCAT44(insn >> 6,insn >> 8) & 0x100000001;
          local_38.mode = insn & 0x1f;
          if ((insn >> 9 & 1) == 0) {
            _Var6 = trans_CPS((DisasContext_conflict1 *)dcbase,&local_38);
            goto LAB_0063eeef;
          }
        }
        break;
      case 0x7a:
        uVar11 = (insn & 0x1700000) - 0x100000;
        switch(uVar11 * 0x800 | uVar11 >> 0x15) {
        case 0:
switchD_0063ee32_caseD_0:
          if (((uint)uVar2 >> 0xc & 1) != 0) goto LAB_0063edf7;
          break;
        case 2:
switchD_0063ee32_caseD_1:
          if (((~insn & 0xf000) == 0) && ((uVar2 & 0x20) != 0)) goto LAB_0063edf7;
          break;
        case 8:
switchD_0063ee32_caseD_4:
          if ((~insn & 0xf000) == 0) goto switchD_0063ee32_caseD_0;
          break;
        case 10:
switchD_0063ee32_caseD_5:
          if ((~insn & 0xf000) == 0) goto LAB_0063edf7;
          break;
        case 0xb:
          switch((insn & 0x8ffff0) - 0xff010 >> 4) {
          case DISAS_NEXT:
            if ((~insn & 0xf) == 0) {
              _Var6 = trans_CLREX((DisasContext_conflict1 *)dcbase,a);
              goto LAB_0063eeef;
            }
            break;
          case DISAS_TARGET_0:
          case DISAS_TARGET_1:
            if ((uVar2 & 0x220) != 0) {
              tcg_gen_mb_aarch64(*(TCGContext_conflict1 **)(dcbase[8].pc_next + 0x2e8),
                                 TCG_BAR_SC|TCG_MO_ALL);
              goto LAB_0063edf7;
            }
            break;
          case DISAS_TARGET_2:
            if ((uVar2 & 0x220) != 0) {
              gen_goto_tb((DisasContext_conflict1 *)dcbase,0,dcbase->pc_next);
              goto LAB_0063edf7;
            }
            break;
          case DISAS_TARGET_3:
            if ((insn & (DISAS_TARGET_11|DISAS_TOO_MANY)) == DISAS_NEXT) {
              _Var6 = trans_SB((DisasContext_conflict1 *)dcbase,a);
              goto LAB_0063eeef;
            }
          }
        }
        break;
      case 0x7b:
        uVar11 = (insn & 0x1700010) - 0x100000;
        switch(uVar11 * 0x400 | uVar11 >> 0x16) {
        case 0:
          goto switchD_0063ee32_caseD_0;
        case 1:
          goto switchD_0063ee32_caseD_1;
        case 4:
          goto switchD_0063ee32_caseD_4;
        case 5:
          goto switchD_0063ee32_caseD_5;
        }
        break;
      case 0x7c:
        if ((insn & 0x50ffe0) == 0x400500) {
          local_38.I = insn >> 0x15 & 1;
          local_38._0_8_ = CONCAT44(insn >> 0x17,insn) & 0x30000001f;
          if ((insn & 0xf0000) == 0xd0000) {
            _Var6 = trans_SRS((DisasContext_conflict1 *)dcbase,(arg_SRS *)&local_38);
            goto LAB_0063eeef;
          }
        }
        else if ((insn & 0x50ffe0) == 0x100a00) {
          local_38.I = insn >> 0x15 & 1;
          local_38._0_8_ = CONCAT44(insn >> 0x10,insn >> 0x17) & 0xf00000003;
          if ((insn & 0x1f) == DISAS_NEXT) {
            _Var6 = trans_RFE((DisasContext_conflict1 *)dcbase,(arg_RFE *)&local_38);
            goto LAB_0063eeef;
          }
        }
        break;
      case 0x7d:
        local_38.A = ((int)(insn << 8) >> 7 | insn >> 0x18 & 1) * 2;
        _Var6 = trans_BLX_i((DisasContext_conflict1 *)dcbase,(arg_BLX_i *)&local_38);
LAB_0063eeef:
        if (_Var6 != false) goto LAB_0063edf7;
      }
      _Var6 = disas_vfp_uncond((DisasContext_conflict1 *)dcbase,insn);
      if (_Var6) goto LAB_0063edf7;
      if ((insn & 0xe000000) == 0x2000000) {
        if ((dcbase[4].pc_first & 0x100) == 0) goto LAB_0063edef;
        iVar8 = disas_neon_data_insn((DisasContext_conflict1 *)dcbase,insn);
      }
      else if ((insn & 0xf100000) == 0x4000000) {
        if ((dcbase[4].pc_first & 0x100) == 0) goto LAB_0063edef;
        iVar8 = disas_neon_ls_insn((DisasContext_conflict1 *)dcbase,insn);
      }
      else if ((insn & 0xe000f00) == 0xc000100) {
        if (((dcbase[4].pc_first & 4) == 0) || ((dcbase[4].num_insns & 2) == 0)) goto LAB_0063edef;
        iVar8 = disas_iwmmxt_insn((DisasContext_conflict1 *)dcbase,insn);
      }
      else if (((insn & 0xe000a00) == 0xc000800) && ((dcbase[4].pc_first & 0x8000000) != 0)) {
        iVar8 = disas_neon_insn_3same_ext((DisasContext_conflict1 *)dcbase,insn);
      }
      else {
        if (((insn & 0xf000a00) != 0xe000800) || ((dcbase[4].pc_first & 0x8000000) == 0))
        goto LAB_0063edef;
        iVar8 = disas_neon_insn_2reg_scalar_ext((DisasContext_conflict1 *)dcbase,insn);
      }
LAB_0063edeb:
      if (iVar8 == 0) goto LAB_0063edf7;
    }
  }
LAB_0063edef:
  unallocated_encoding_aarch64((DisasContext_conflict1 *)dcbase);
LAB_0063edf7:
  arm_post_translate_insn((DisasContext_conflict1 *)dcbase);
  return;
}

Assistant:

static void arm_tr_translate_insn(DisasContextBase *dcbase, CPUState *cpu)
{
    DisasContext *dc = container_of(dcbase, DisasContext, base);
    CPUARMState *env = cpu->env_ptr;
    unsigned int insn;

    if (arm_pre_translate_insn(dc)) {
        return;
    }

    // Unicorn: end address tells us to stop emulation
    if (uc_addr_is_exit(dc->uc, dcbase->pc_next)) {
        // imitate WFI instruction to halt emulation
        dcbase->is_jmp = DISAS_WFI;
    } else {
        dc->pc_curr = dc->base.pc_next;
        insn = arm_ldl_code(env, dc->base.pc_next, dc->sctlr_b);
        dc->insn = insn;

        // Unicorn:
        //
        // If we get an error during fetching code, we have to skip the instruction decoding
        // to ensure the PC remains unchanged.
        //
        // This is to keep the same behavior with Unicorn1, though, it's inconsistent with
        // official arm documents.
        //
        // See discussion here: https://github.com/unicorn-engine/unicorn/issues/1536
        if (dc->uc->invalid_error) {
            dcbase->is_jmp = DISAS_WFI;
            return;
        }

        dc->base.pc_next += 4;
        disas_arm_insn(dc, insn);

        arm_post_translate_insn(dc);

        /* ARM is a fixed-length ISA.  We performed the cross-page check
           in init_disas_context by adjusting max_insns.  */
    }
}